

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O3

Read<signed_char>
Omega_h::inertia::mark_bisection_given_axis
          (CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> axis)

{
  int *piVar1;
  Alloc *pAVar2;
  Real total_mass;
  Vector<3> center_00;
  Alloc *pAVar3;
  ulong *in_RCX;
  ulong uVar4;
  ulong uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Read<signed_char> RVar7;
  Vector<3> center;
  Reals local_d0;
  Reals local_c0;
  Reals local_b0;
  CommPtr local_a0;
  Reals local_90;
  CommPtr local_80;
  Real local_70;
  Alloc *local_68;
  ulong local_60;
  Reals local_58;
  Vector<3> local_48;
  void *pvVar6;
  
  pAVar2 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar4 = pAVar2->size;
  }
  else {
    uVar4 = (ulong)pAVar2 >> 3;
  }
  local_90.write_.shared_alloc_.alloc = (Alloc *)*in_RCX;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 1) == 0) {
    uVar5 = (local_90.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar5 = (ulong)local_90.write_.shared_alloc_.alloc >> 3;
  }
  if ((int)(uVar5 >> 3) * 3 == (int)(uVar4 >> 3)) {
    local_80.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(coords->write_).shared_alloc_.alloc;
    local_80.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(coords->write_).shared_alloc_.direct_ptr;
    if (local_80.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_80.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        local_90.write_.shared_alloc_.alloc = (Alloc *)*in_RCX;
      }
      else {
        (local_80.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_80.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
        local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_90.write_.shared_alloc_.alloc =
             (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_90.write_.shared_alloc_.alloc)->use_count =
             (local_90.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_90.write_.shared_alloc_.direct_ptr = (void *)in_RCX[1];
    local_70 = tolerance;
    total_mass = repro_sum(&local_80,&local_90);
    pAVar2 = local_90.write_.shared_alloc_.alloc;
    if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
        local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    if (local_80.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(coords->write_).shared_alloc_.alloc;
    local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(coords->write_).shared_alloc_.direct_ptr;
    if (local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_b0.write_.shared_alloc_.alloc = (masses->write_).shared_alloc_.alloc;
    if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b0.write_.shared_alloc_.alloc =
             (Alloc *)((local_b0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b0.write_.shared_alloc_.alloc)->use_count =
             (local_b0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar2 = local_b0.write_.shared_alloc_.alloc;
    local_b0.write_.shared_alloc_.direct_ptr = (masses->write_).shared_alloc_.direct_ptr;
    local_58.write_.shared_alloc_.alloc = (Alloc *)*in_RCX;
    if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.write_.shared_alloc_.alloc =
             (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_58.write_.shared_alloc_.alloc)->use_count =
             (local_58.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar3 = local_58.write_.shared_alloc_.alloc;
    local_58.write_.shared_alloc_.direct_ptr = (void *)in_RCX[1];
    anon_unknown_0::get_center(&local_48,&local_a0,&local_b0,&local_58,total_mass);
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
      piVar1 = &pAVar2->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar2);
        operator_delete(pAVar2,0x48);
      }
    }
    if (local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_c0.write_.shared_alloc_.alloc = (coords->write_).shared_alloc_.alloc;
    local_c0.write_.shared_alloc_.direct_ptr = (coords->write_).shared_alloc_.direct_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0.write_.shared_alloc_.direct_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0.write_.shared_alloc_.direct_ptr)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_c0.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0.write_.shared_alloc_.direct_ptr)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_c0.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
      }
    }
    local_d0.write_.shared_alloc_.alloc = (masses->write_).shared_alloc_.alloc;
    if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.write_.shared_alloc_.alloc =
             (Alloc *)((local_d0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_d0.write_.shared_alloc_.alloc)->use_count =
             (local_d0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar2 = local_d0.write_.shared_alloc_.alloc;
    local_d0.write_.shared_alloc_.direct_ptr = (masses->write_).shared_alloc_.direct_ptr;
    local_68 = (Alloc *)*in_RCX;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68 = (Alloc *)(local_68->size * 8 + 1);
      }
      else {
        local_68->use_count = local_68->use_count + 1;
      }
    }
    pAVar3 = local_68;
    local_60 = in_RCX[1];
    center_00.super_Few<double,_3>.array_[1] = local_48.super_Few<double,_3>.array_[1];
    center_00.super_Few<double,_3>.array_[0] = local_48.super_Few<double,_3>.array_[0];
    center_00.super_Few<double,_3>.array_[2] = local_48.super_Few<double,_3>.array_[2];
    RVar7 = anon_unknown_0::mark_bisection_internal
                      (comm,&local_c0,&local_d0,local_70,axis,center_00,total_mass);
    pvVar6 = RVar7.write_.shared_alloc_.direct_ptr;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
        pvVar6 = extraout_RDX;
      }
    }
    if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
      piVar1 = &pAVar2->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar2);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0.write_.shared_alloc_.direct_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_c0.write_.shared_alloc_.direct_ptr);
      pvVar6 = extraout_RDX_01;
    }
    RVar7.write_.shared_alloc_.direct_ptr = pvVar6;
    RVar7.write_.shared_alloc_.alloc = (Alloc *)comm;
    return (Read<signed_char>)RVar7.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","coords.size() == masses.size() * 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
       ,0x9b);
}

Assistant:

Read<I8> mark_bisection_given_axis(
    CommPtr comm, Reals coords, Reals masses, Real tolerance, Vector<3> axis) {
  OMEGA_H_CHECK(coords.size() == masses.size() * 3);
  auto total_mass = repro_sum(comm, masses);
  auto center = get_center(comm, coords, masses, total_mass);
  return mark_bisection_internal(
      comm, coords, masses, tolerance, axis, center, total_mass);
}